

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O2

ngx_int_t ngx_http_index_error
                    (ngx_http_request_t *r,ngx_http_core_loc_conf_t *clcf,u_char *file,ngx_err_t err
                    )

{
  char *fmt;
  ngx_int_t nVar1;
  ngx_log_t *log;
  
  if (err == 0xd) {
    log = r->connection->log;
    nVar1 = 0x193;
    if (log->log_level < 4) {
      return 0x193;
    }
    fmt = "\"%s\" is forbidden";
    err = 0xd;
  }
  else {
    nVar1 = 0x194;
    if (clcf->log_not_found == 0) {
      return 0x194;
    }
    log = r->connection->log;
    if (log->log_level < 4) {
      return 0x194;
    }
    fmt = "\"%s\" is not found";
  }
  ngx_log_error_core(4,log,err,fmt,file);
  return nVar1;
}

Assistant:

static ngx_int_t
ngx_http_index_error(ngx_http_request_t *r, ngx_http_core_loc_conf_t  *clcf,
    u_char *file, ngx_err_t err)
{
    if (err == NGX_EACCES) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, err,
                      "\"%s\" is forbidden", file);

        return NGX_HTTP_FORBIDDEN;
    }

    if (clcf->log_not_found) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, err,
                      "\"%s\" is not found", file);
    }

    return NGX_HTTP_NOT_FOUND;
}